

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
resizeLike<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,false>>
          (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this,
          EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>_> *_other)

{
  Index nbRows;
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_00;
  Index IVar1;
  EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>_> *in_RSI;
  Index in_RDI;
  bool bVar2;
  Index othersize;
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false> *other;
  
  EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>_>::derived(in_RSI);
  nbRows = MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0>::rows
                     ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0> *
                      )0x30b801);
  MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0>::cols
            ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0> *)0x30b810
            );
  this_00 = (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
            MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0>::rows
                      ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0>
                        *)0x30b829);
  MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0>::cols
            ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0> *)0x30b838
            );
  IVar1 = MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0>::rows
                    ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0> *)
                     0x30b853);
  bVar2 = true;
  if (IVar1 != 1) {
    IVar1 = MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0>::cols
                      ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_false>,_0>
                        *)0x30b86c);
    bVar2 = IVar1 == 1;
  }
  if (!bVar2) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x147,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 2, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, 2, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize(this_00,nbRows,in_RDI);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(Index(other.rows()), Index(other.cols()));
      const Index othersize = Index(other.rows())*Index(other.cols());
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }